

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O0

shared_ptr<Kandinsky::BaseExpression>
Kandinsky::BaseExpression::makePtr<Kandinsky::Expression>(Expression *arg)

{
  Expression *in_RDI;
  BaseExpressionPtr BVar1;
  shared_ptr<Kandinsky::BaseExpression> sVar2;
  
  BVar1 = Expression::getBaseExpressionPtr(in_RDI);
  sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<Kandinsky::BaseExpression>)
         sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BaseExpression> BaseExpression::makePtr<Expression>(const Expression& arg)
    {
        return arg.getBaseExpressionPtr();
    }